

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ushort uVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_short> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterYRef *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar23;
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  pIVar16 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  uVar5 = *(ushort *)
           ((long)pGVar8->Ys +
           (long)(((prim + pGVar8->Offset) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride);
  dVar20 = log10((pGVar8->XScale * (double)prim + pGVar8->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar21 = log10((double)uVar5 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar9->YAxis;
  pIVar10 = pIVar16->CurrentPlot;
  auVar31._8_8_ = pIVar16->LogDenY[iVar18];
  auVar31._0_8_ = dVar1;
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  auVar27._8_8_ = dVar21;
  auVar27._0_8_ = dVar20;
  dVar1 = pGVar11->YRef;
  auVar28 = divpd(auVar27,auVar31);
  dVar20 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar24 = (float)(pIVar16->Mx *
                   (((double)(float)auVar28._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar25 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)auVar28._8_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar20) +
                    dVar20) - dVar20) + (double)IVar4.y);
  dVar21 = log10(((double)prim * pGVar11->XScale + pGVar11->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar2 = pIVar17->LogDenX;
  dVar3 = (pIVar10->XAxis).Range.Min;
  dVar20 = (pIVar10->XAxis).Range.Max;
  auVar22._0_8_ = log10(dVar1 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  auVar22._8_8_ = dVar21;
  auVar14._8_4_ = SUB84(dVar2,0);
  auVar14._0_8_ = pIVar17->LogDenY[iVar18];
  auVar14._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar28 = divpd(auVar22,auVar14);
  pIVar10 = pIVar17->CurrentPlot;
  dVar1 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar19 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar28._0_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar23 = (float)(pIVar17->Mx *
                   (((double)(float)auVar28._8_8_ * (dVar20 - dVar3) + dVar3) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  auVar32._0_4_ = ~-(uint)(fVar23 <= fVar24) & (uint)fVar23;
  auVar32._4_4_ = ~-(uint)(fVar19 <= fVar25) & (uint)fVar19;
  auVar32._8_4_ = ~-(uint)(fVar24 < fVar23) & (uint)fVar23;
  auVar32._12_4_ = ~-(uint)(fVar25 < fVar19) & (uint)fVar19;
  auVar28._4_4_ = (uint)fVar25 & -(uint)(fVar19 <= fVar25);
  auVar28._0_4_ = (uint)fVar24 & -(uint)(fVar23 <= fVar24);
  auVar28._8_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar23);
  auVar28._12_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar19);
  auVar32 = auVar32 | auVar28;
  fVar26 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar32._8_8_;
  auVar15._0_4_ = -(uint)(auVar32._4_4_ < fVar26);
  auVar33._0_8_ = auVar15._0_8_ << 0x20;
  auVar33._8_4_ = -(uint)(auVar32._8_4_ < (cull_rect->Max).x);
  auVar33._12_4_ = -(uint)(auVar32._12_4_ < (cull_rect->Max).y);
  auVar34._4_4_ = -(uint)(fVar26 < auVar32._4_4_);
  auVar34._0_4_ = -(uint)((cull_rect->Min).x < auVar32._0_4_);
  auVar34._8_8_ = auVar33._8_8_;
  iVar18 = movmskps(iVar18 * 0x10,auVar34);
  if (iVar18 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar26 = fVar19 - fVar25;
    fVar29 = fVar23 - fVar24;
    fVar30 = fVar29 * fVar29 + fVar26 * fVar26;
    if (0.0 < fVar30) {
      fVar30 = 1.0 / SQRT(fVar30);
      fVar26 = fVar26 * fVar30;
      fVar29 = fVar29 * fVar30;
    }
    fVar30 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar26 = fVar30 * fVar26;
    fVar30 = fVar30 * fVar29;
    (pIVar12->pos).x = fVar26 + fVar24;
    (pIVar12->pos).y = fVar25 - fVar30;
    (pIVar12->uv).x = IVar4.x;
    (pIVar12->uv).y = IVar4.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar26 + fVar23;
    pIVar12[1].pos.y = fVar19 - fVar30;
    pIVar12[1].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar23 - fVar26;
    pIVar12[2].pos.y = fVar30 + fVar19;
    pIVar12[2].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar24 - fVar26;
    pIVar12[3].pos.y = fVar30 + fVar25;
    pIVar12[3].uv = IVar4;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13 = DrawList->_IdxWritePtr;
    *puVar13 = uVar7;
    puVar13[1] = uVar7 + 1;
    puVar13[2] = DrawList->_VtxCurrentIdx + 2;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar13[3] = uVar7;
    puVar13[4] = uVar7 + 2;
    puVar13[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar13 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }